

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

int getEndBiome(int hx,int hz,uint16_t *hmap,int hw)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int in_ECX;
  long lVar4;
  ushort *in_RDX;
  int in_ESI;
  int in_EDI;
  uint32_t u;
  uint16_t e;
  uint16_t dsj;
  uint32_t h;
  uint16_t *p_elev;
  uint16_t *p_dsj;
  uint16_t *p_dsi;
  uint16_t ds [26];
  int j;
  int i;
  uint local_74;
  ushort *local_70;
  ushort local_58 [26];
  int local_24;
  int local_1c;
  ushort *local_18;
  int local_c;
  int local_8;
  int local_4;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  memcpy(local_58,&DAT_001998c0,0x34);
  lVar4 = (long)(int)(uint)(local_8 < 0);
  local_70 = local_18;
  iVar2 = local_8;
  if (local_8 < 1) {
    iVar2 = -local_8;
  }
  if (iVar2 < 0x10) {
    iVar2 = local_c;
    if (local_c < 1) {
      iVar2 = -local_c;
    }
    if (iVar2 < 0x10) {
      local_74 = (local_8 * local_8 + local_c * local_c) * 0x40;
      goto LAB_0012a24e;
    }
  }
  local_74 = 0x3841;
LAB_0012a24e:
  for (local_24 = 0; local_24 < 0x19; local_24 = local_24 + 1) {
    uVar1 = local_58[(long)(int)(uint)(local_c < 0) + (long)local_24];
    if ((*local_70 != 0) &&
       (uVar3 = ((uint)local_58[lVar4] + (uint)uVar1) * (uint)*local_70, uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[1] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 1] + (uint)uVar1) * (uint)local_70[1], uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[2] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 2] + (uint)uVar1) * (uint)local_70[2], uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[3] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 3] + (uint)uVar1) * (uint)local_70[3], uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[4] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 4] + (uint)uVar1) * (uint)local_70[4], uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[5] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 5] + (uint)uVar1) * (uint)local_70[5], uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[6] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 6] + (uint)uVar1) * (uint)local_70[6], uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[7] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 7] + (uint)uVar1) * (uint)local_70[7], uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[8] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 8] + (uint)uVar1) * (uint)local_70[8], uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[9] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 9] + (uint)uVar1) * (uint)local_70[9], uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[10] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 10] + (uint)uVar1) * (uint)local_70[10], uVar3 < local_74))
    {
      local_74 = uVar3;
    }
    if ((local_70[0xb] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0xb] + (uint)uVar1) * (uint)local_70[0xb], uVar3 < local_74)
       ) {
      local_74 = uVar3;
    }
    if ((local_70[0xc] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0xc] + (uint)uVar1) * (uint)local_70[0xc], uVar3 < local_74)
       ) {
      local_74 = uVar3;
    }
    if ((local_70[0xd] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0xd] + (uint)uVar1) * (uint)local_70[0xd], uVar3 < local_74)
       ) {
      local_74 = uVar3;
    }
    if ((local_70[0xe] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0xe] + (uint)uVar1) * (uint)local_70[0xe], uVar3 < local_74)
       ) {
      local_74 = uVar3;
    }
    if ((local_70[0xf] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0xf] + (uint)uVar1) * (uint)local_70[0xf], uVar3 < local_74)
       ) {
      local_74 = uVar3;
    }
    if ((local_70[0x10] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0x10] + (uint)uVar1) * (uint)local_70[0x10],
       uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[0x11] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0x11] + (uint)uVar1) * (uint)local_70[0x11],
       uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[0x12] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0x12] + (uint)uVar1) * (uint)local_70[0x12],
       uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[0x13] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0x13] + (uint)uVar1) * (uint)local_70[0x13],
       uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[0x14] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0x14] + (uint)uVar1) * (uint)local_70[0x14],
       uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[0x15] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0x15] + (uint)uVar1) * (uint)local_70[0x15],
       uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[0x16] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0x16] + (uint)uVar1) * (uint)local_70[0x16],
       uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[0x17] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0x17] + (uint)uVar1) * (uint)local_70[0x17],
       uVar3 < local_74)) {
      local_74 = uVar3;
    }
    if ((local_70[0x18] != 0) &&
       (uVar3 = ((uint)local_58[lVar4 + 0x18] + (uint)uVar1) * (uint)local_70[0x18],
       uVar3 < local_74)) {
      local_74 = uVar3;
    }
    local_70 = local_70 + local_1c;
  }
  if (local_74 < 0xe10) {
    local_4 = 0x2a;
  }
  else if (local_74 < 0x2711) {
    local_4 = 0x29;
  }
  else if (local_74 < 0x3841) {
    local_4 = 0x2b;
  }
  else {
    local_4 = 0x28;
  }
  return local_4;
}

Assistant:

static int getEndBiome(int hx, int hz, const uint16_t *hmap, int hw)
{
    int i, j;
    const uint16_t ds[26] = { // (25-2*i)*(25-2*i)
        //  0    1    2    3    4    5    6    7    8    9   10   11   12
          625, 529, 441, 361, 289, 225, 169, 121,  81,  49,  25,   9,   1,
        // 13   14   15   16   17   18   19   20   21   22   23   24,  25
            1,   9,  25,  49,  81, 121, 169, 225, 289, 361, 441, 529, 625,
    };

    const uint16_t *p_dsi = ds + (hx < 0);
    const uint16_t *p_dsj = ds + (hz < 0);
    const uint16_t *p_elev = hmap;
    uint32_t h;

    if (abs(hx) <= 15 && abs(hz) <= 15)
        h = 64 * (hx*hx + hz*hz);
    else
        h = 14401;

    for (j = 0; j < 25; j++)
    {
        uint16_t dsj = p_dsj[j];
        uint16_t e;
        uint32_t u;

        // force unroll for(i=0;i<25;i++) in a cross compatible way
        #define x5(i,x)    { x; i++; x; i++; x; i++; x; i++; x; i++; }
        #define for25(i,x) { i = 0; x5(i,x) x5(i,x) x5(i,x) x5(i,x) x5(i,x) }
        for25(i,
            if unlikely(e = p_elev[i])
            {
                if ((u = (p_dsi[i] + (uint32_t)dsj) * e) < h)
                    h = u;
            }
        );
        #undef for25
        #undef x5
        p_elev += hw;
    }

    if (h < 3600)
        return end_highlands;
    else if (h <= 10000)
        return end_midlands;
    else if (h <= 14400)
        return end_barrens;

    return small_end_islands;
}